

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O2

int set_archive_flag(char **argv)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  
  pcVar1 = *argv;
  iVar2 = parse_archive_flag(pcVar1);
  if (iVar2 < 0) {
    fprintf(_stderr,"invalid archive flag \'%s\'\n",pcVar1);
  }
  else {
    pcVar1 = argv[1];
    iVar3 = strcasecmp(pcVar1,"1");
    uVar5 = 1;
    if ((iVar3 != 0) && (iVar3 = strcasecmp(pcVar1,"true"), iVar3 != 0)) {
      iVar3 = strcasecmp(pcVar1,"yes");
      uVar5 = (ulong)(iVar3 == 0);
    }
    iVar2 = zip_set_archive_flag(za,iVar2,uVar5);
    __stream = _stderr;
    if (-1 < iVar2) {
      return 0;
    }
    pcVar1 = *argv;
    uVar4 = zip_strerror(za);
    fprintf(__stream,"can\'t set archive flag \'%s\' to %d: %s\n",pcVar1,uVar5,uVar4);
  }
  return -1;
}

Assistant:

static int
set_archive_flag(char *argv[]) {
    int flag = parse_archive_flag(argv[0]);
    if (flag < 0) {
        fprintf(stderr, "invalid archive flag '%s'\n", argv[0]);
        return -1;
    }

    int value = strcasecmp(argv[1], "1") == 0 || strcasecmp(argv[1], "true") == 0 || strcasecmp(argv[1], "yes") == 0;

    if (zip_set_archive_flag(za, flag, value) < 0) {
        fprintf(stderr, "can't set archive flag '%s' to %d: %s\n", argv[0], value, zip_strerror(za));
        return -1;
    }
    return 0;
}